

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

int Au_ManFindNtk(Au_Man_t *p,char *pName)

{
  int iVar1;
  Au_Ntk_t *p_00;
  char *__s1;
  int local_2c;
  int i;
  Au_Ntk_t *pNtk;
  char *pName_local;
  Au_Man_t *p_local;
  
  local_2c = 1;
  while( true ) {
    iVar1 = Vec_PtrSize(&p->vNtks);
    if (iVar1 <= local_2c) {
      return -1;
    }
    p_00 = Au_ManNtk(p,local_2c);
    __s1 = Au_NtkName(p_00);
    iVar1 = strcmp(__s1,pName);
    if (iVar1 == 0) break;
    local_2c = local_2c + 1;
  }
  return local_2c;
}

Assistant:

int Au_ManFindNtk( Au_Man_t * p, char * pName )
{
    Au_Ntk_t * pNtk;
    int i;
    Au_ManForEachNtk( p, pNtk, i )
        if ( !strcmp(Au_NtkName(pNtk), pName) )
            return i;
    return -1;
}